

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

_Bool upb_Map_Delete(upb_Map *map,upb_MessageValue key,upb_MessageValue *val)

{
  _Bool _Var1;
  upb_value uStack_30;
  _Bool removed;
  upb_value v;
  upb_MessageValue *val_local;
  upb_Map *map_local;
  upb_MessageValue key_local;
  
  key_local.int64_val = key.str_val.size;
  map_local = key.map_val;
  v.val = (uint64_t)val;
  _Var1 = _upb_Map_Delete(map,&map_local,(long)map->key_size,&stack0xffffffffffffffd0);
  if (v.val != 0) {
    _upb_map_fromvalue(uStack_30,(void *)v.val,(long)map->val_size);
  }
  return _Var1;
}

Assistant:

UPB_INLINE bool _upb_Map_Delete(struct upb_Map* map, const void* key,
                                size_t key_size, upb_value* val) {
  UPB_ASSERT(!upb_Map_IsFrozen(map));

  if (map->UPB_PRIVATE(is_strtable)) {
    upb_StringView k = _upb_map_tokey(key, key_size);
    return upb_strtable_remove2(&map->t.strtable, k.data, k.size, val);
  } else {
    uintptr_t intkey = _upb_map_tointkey(key, key_size);
    return upb_inttable_remove(&map->t.inttable, intkey, val);
  }
}